

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O3

WebPAnimEncoder *
WebPAnimEncoderNewInternal(int width,int height,WebPAnimEncoderOptions *enc_options,int abi_version)

{
  int *piVar1;
  WebPPicture *picture;
  WebPPicture *picture_00;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  WebPAnimEncoder *enc;
  EncodedFrame *pEVar13;
  WebPMux *pWVar14;
  uint uVar15;
  int iVar16;
  char *__format;
  
  if ((abi_version & 0xffffff00U) != 0x100) {
    return (WebPAnimEncoder *)0x0;
  }
  if (height < 1 || width < 1) {
    return (WebPAnimEncoder *)0x0;
  }
  if ((int)((ulong)(uint)width * (ulong)(uint)height >> 0x20) != 0) {
    return (WebPAnimEncoder *)0x0;
  }
  enc = (WebPAnimEncoder *)WebPSafeCalloc(1,0x510);
  if (enc == (WebPAnimEncoder *)0x0) {
    return (WebPAnimEncoder *)0x0;
  }
  enc->error_str_[0] = '\0';
  enc->canvas_width_ = width;
  enc->canvas_height_ = height;
  if (enc_options == (WebPAnimEncoderOptions *)0x0) {
    (enc->options_).kmax = 0x7fffffff;
    (enc->options_).allow_mixed = 0;
    (enc->options_).anim_params.bgcolor = 0xffffffff;
    (enc->options_).anim_params.loop_count = 0;
    (enc->options_).minimize_size = 0;
    (enc->options_).kmin = 0x7ffffffe;
    (enc->options_).verbose = 0;
    goto LAB_0014b614;
  }
  uVar2 = (enc_options->anim_params).bgcolor;
  iVar11 = (enc_options->anim_params).loop_count;
  iVar16 = enc_options->minimize_size;
  iVar3 = enc_options->kmin;
  iVar4 = enc_options->kmax;
  iVar5 = enc_options->allow_mixed;
  iVar6 = enc_options->verbose;
  uVar7 = enc_options->padding[0];
  uVar8 = enc_options->padding[1];
  uVar9 = enc_options->padding[2];
  uVar10 = enc_options->padding[3];
  (enc->options_).padding[0] = enc_options->padding[0];
  (enc->options_).padding[1] = uVar8;
  (enc->options_).padding[2] = uVar9;
  (enc->options_).padding[3] = uVar10;
  (enc->options_).kmax = iVar4;
  (enc->options_).allow_mixed = iVar5;
  (enc->options_).verbose = iVar6;
  (enc->options_).padding[0] = uVar7;
  (enc->options_).anim_params.bgcolor = uVar2;
  (enc->options_).anim_params.loop_count = iVar11;
  (enc->options_).minimize_size = iVar16;
  (enc->options_).kmin = iVar3;
  iVar11 = (enc->options_).verbose;
  if ((enc->options_).minimize_size == 0) {
    uVar15 = (enc->options_).kmax;
    if (uVar15 == 1) {
      (enc->options_).kmin = 0;
      (enc->options_).kmax = 0;
      goto LAB_0014b614;
    }
    if ((int)uVar15 < 1) {
      (enc->options_).kmin = 0x7ffffffe;
      (enc->options_).kmax = 0x7fffffff;
      iVar11 = 0;
      goto LAB_0014b57d;
    }
    iVar16 = (enc->options_).kmin;
    if (iVar16 < (int)uVar15) goto LAB_0014b587;
    uVar12 = uVar15 - 1;
    (enc->options_).kmin = uVar12;
    if (iVar11 != 0) {
      __format = "WARNING: Setting kmin = %d, so that kmin < kmax.\n";
      goto LAB_0014b7d1;
    }
LAB_0014b5ac:
    iVar11 = 0;
  }
  else {
    (enc->options_).kmin = 0x7ffffffe;
    (enc->options_).kmax = 0x7fffffff;
LAB_0014b57d:
    iVar16 = 0x7ffffffe;
    uVar15 = 0x7fffffff;
LAB_0014b587:
    uVar12 = (uVar15 >> 1) + 1;
    if (uVar12 < uVar15 && iVar16 <= (int)(uVar15 >> 1)) {
      (enc->options_).kmin = uVar12;
      if (iVar11 == 0) goto LAB_0014b5ac;
      __format = "WARNING: Setting kmin = %d, so that kmin >= kmax / 2 + 1.\n";
LAB_0014b7d1:
      fprintf(stderr,__format,(ulong)uVar12);
      iVar11 = 1;
    }
  }
  iVar16 = (enc->options_).kmax;
  piVar1 = &(enc->options_).kmin;
  if (0x1e < iVar16 - *piVar1) {
    uVar15 = iVar16 - 0x1e;
    *piVar1 = uVar15;
    if (iVar11 != 0) {
      fprintf(stderr,"WARNING: Setting kmin = %d, so that kmax - kmin <= %d.\n",(ulong)uVar15,0x1e);
    }
  }
LAB_0014b614:
  picture = &enc->curr_canvas_copy_;
  iVar11 = WebPPictureInitInternal(picture,0x210);
  if (iVar11 != 0) {
    picture_00 = &enc->prev_canvas_;
    iVar11 = WebPPictureInitInternal(picture_00,0x210);
    if (iVar11 != 0) {
      iVar11 = WebPPictureInitInternal(&enc->prev_canvas_disposed_,0x210);
      if (iVar11 != 0) {
        (enc->curr_canvas_copy_).width = width;
        (enc->curr_canvas_copy_).height = height;
        (enc->curr_canvas_copy_).use_argb = 1;
        iVar11 = WebPPictureAlloc(picture);
        if (((iVar11 != 0) && (iVar11 = WebPPictureCopy(picture,picture_00), iVar11 != 0)) &&
           (iVar11 = WebPPictureCopy(picture,&enc->prev_canvas_disposed_), iVar11 != 0)) {
          WebPUtilClearPic(picture_00,(FrameRectangle *)0x0);
          enc->curr_canvas_copy_modified_ = 1;
          enc->start_ = 0;
          enc->count_ = 0;
          enc->flush_count_ = 0;
          enc->best_delta_ = 0x100000000;
          enc->keyframe_ = -1;
          uVar12 = ((enc->options_).kmax - (enc->options_).kmin) + 1;
          uVar15 = 2;
          if (2 < uVar12) {
            uVar15 = uVar12;
          }
          enc->size_ = (long)(int)uVar15;
          pEVar13 = (EncodedFrame *)WebPSafeCalloc((long)(int)uVar15,0x68);
          enc->encoded_frames_ = pEVar13;
          if (pEVar13 != (EncodedFrame *)0x0) {
            pWVar14 = WebPNewInternal(0x109);
            enc->mux_ = pWVar14;
            if (pWVar14 != (WebPMux *)0x0) {
              enc->count_since_key_frame_ = 0;
              enc->first_timestamp_ = 0;
              enc->prev_timestamp_ = 0;
              enc->prev_candidate_undecided_ = 0;
              enc->is_first_frame_ = 1;
              enc->got_null_frame_ = 0;
              return enc;
            }
          }
        }
      }
    }
  }
  WebPAnimEncoderDelete(enc);
  return (WebPAnimEncoder *)0x0;
}

Assistant:

WebPAnimEncoder* WebPAnimEncoderNewInternal(
    int width, int height, const WebPAnimEncoderOptions* enc_options,
    int abi_version) {
  WebPAnimEncoder* enc;

  if (WEBP_ABI_IS_INCOMPATIBLE(abi_version, WEBP_MUX_ABI_VERSION)) {
    return NULL;
  }
  if (width <= 0 || height <= 0 ||
      (width * (uint64_t)height) >= MAX_IMAGE_AREA) {
    return NULL;
  }

  enc = (WebPAnimEncoder*)WebPSafeCalloc(1, sizeof(*enc));
  if (enc == NULL) return NULL;
  MarkNoError(enc);

  // Dimensions and options.
  *(int*)&enc->canvas_width_ = width;
  *(int*)&enc->canvas_height_ = height;
  if (enc_options != NULL) {
    *(WebPAnimEncoderOptions*)&enc->options_ = *enc_options;
    SanitizeEncoderOptions((WebPAnimEncoderOptions*)&enc->options_);
  } else {
    DefaultEncoderOptions((WebPAnimEncoderOptions*)&enc->options_);
  }

  // Canvas buffers.
  if (!WebPPictureInit(&enc->curr_canvas_copy_) ||
      !WebPPictureInit(&enc->prev_canvas_) ||
      !WebPPictureInit(&enc->prev_canvas_disposed_)) {
    goto Err;
  }
  enc->curr_canvas_copy_.width = width;
  enc->curr_canvas_copy_.height = height;
  enc->curr_canvas_copy_.use_argb = 1;
  if (!WebPPictureAlloc(&enc->curr_canvas_copy_) ||
      !WebPPictureCopy(&enc->curr_canvas_copy_, &enc->prev_canvas_) ||
      !WebPPictureCopy(&enc->curr_canvas_copy_, &enc->prev_canvas_disposed_)) {
    goto Err;
  }
  WebPUtilClearPic(&enc->prev_canvas_, NULL);
  enc->curr_canvas_copy_modified_ = 1;

  // Encoded frames.
  ResetCounters(enc);
  // Note: one extra storage is for the previous frame.
  enc->size_ = enc->options_.kmax - enc->options_.kmin + 1;
  // We need space for at least 2 frames. But when kmin, kmax are both zero,
  // enc->size_ will be 1. So we handle that special case below.
  if (enc->size_ < 2) enc->size_ = 2;
  enc->encoded_frames_ =
      (EncodedFrame*)WebPSafeCalloc(enc->size_, sizeof(*enc->encoded_frames_));
  if (enc->encoded_frames_ == NULL) goto Err;

  enc->mux_ = WebPMuxNew();
  if (enc->mux_ == NULL) goto Err;

  enc->count_since_key_frame_ = 0;
  enc->first_timestamp_ = 0;
  enc->prev_timestamp_ = 0;
  enc->prev_candidate_undecided_ = 0;
  enc->is_first_frame_ = 1;
  enc->got_null_frame_ = 0;

  return enc;  // All OK.

 Err:
  WebPAnimEncoderDelete(enc);
  return NULL;
}